

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

Value * duckdb::DefaultOrderSetting::GetSetting
                  (Value *__return_storage_ptr__,ClientContext *context)

{
  OrderType OVar1;
  DBConfig *pDVar2;
  InternalException *this;
  char *val;
  string local_40;
  
  pDVar2 = DBConfig::GetConfig(context);
  OVar1 = (pDVar2->options).default_order_type;
  if (OVar1 == ASCENDING) {
    val = "asc";
  }
  else {
    if (OVar1 != DESCENDING) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Unknown order type setting","");
      InternalException::InternalException(this,&local_40);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    val = "desc";
  }
  Value::Value(__return_storage_ptr__,val);
  return __return_storage_ptr__;
}

Assistant:

Value DefaultOrderSetting::GetSetting(const ClientContext &context) {
	auto &config = DBConfig::GetConfig(context);
	switch (config.options.default_order_type) {
	case OrderType::ASCENDING:
		return "asc";
	case OrderType::DESCENDING:
		return "desc";
	default:
		throw InternalException("Unknown order type setting");
	}
}